

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O0

void vu_draw_io(t_vu *x,_glist *glist,int old_snd_rcv_flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _glist *p_Var4;
  bool bVar5;
  char *local_288;
  char *tags [3];
  char local_268 [8];
  char tag_n [128];
  char tag [128];
  char tag_label [128];
  char tag_object [128];
  int snd_able;
  int ioh;
  int iow;
  int vmargin;
  int hmargin;
  int ypos;
  int xpos;
  _glist *canvas;
  int zoom;
  int old_snd_rcv_flags_local;
  _glist *glist_local;
  t_vu *x_local;
  
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  p_Var4 = glist_getcanvas(glist);
  iVar2 = text_xpix((t_text *)x,glist);
  iVar3 = text_ypix((t_text *)x,glist);
  bVar5 = true;
  if (((uint)(x->x_gui).x_fsf >> 7 & 1) == 0) {
    bVar5 = ((uint)(x->x_gui).x_fsf >> 6 & 1) != 0;
  }
  local_288 = tag_label + 0x78;
  tags[0] = local_268;
  tags[1] = tag_n + 0x78;
  sprintf(tag_label + 0x78,"%lxOBJ",x);
  sprintf(tag + 0x78,"%lxLABEL",x);
  sprintf(tag_n + 0x78,"%lxOUT",x);
  pdgui_vmess((char *)0x0,"crs",p_Var4,"delete",tag_n + 0x78);
  if (!bVar5) {
    sprintf(local_268,"%lxOUT%d",x);
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var4,"create","rectangle",
                (ulong)(uint)(iVar2 - iVar1),iVar3 + (x->x_gui).x_h,iVar2 + iVar1 * 6,
                iVar3 + (x->x_gui).x_h + iVar1 * 2,"-fill","black","-tags",3,&local_288);
    sprintf(local_268,"%lxOUT%d",x);
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var4,"create","rectangle",
                (ulong)(uint)(iVar2 + (x->x_gui).x_w + iVar1 * -6),iVar3 + (x->x_gui).x_h,
                iVar2 + (x->x_gui).x_w + iVar1,iVar3 + (x->x_gui).x_h + iVar1 * 2,"-fill","black",
                "-tags",3,&local_288);
    pdgui_vmess((char *)0x0,"crss",p_Var4,"lower",tag_n + 0x78,tag + 0x78);
  }
  sprintf(tag_n + 0x78,"%lxIN",x);
  pdgui_vmess((char *)0x0,"crs",p_Var4,"delete",tag_n + 0x78);
  if (((uint)(x->x_gui).x_fsf >> 6 & 1) == 0) {
    sprintf(local_268,"%lxIN%d",x);
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var4,"create","rectangle",
                (ulong)(uint)(iVar2 - iVar1),iVar3 + iVar1 * -2,iVar2 + iVar1 * 6,iVar3,"-fill",
                "black","-tags",3,&local_288);
    sprintf(local_268,"%lxIN%d",x);
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var4,"create","rectangle",
                (ulong)(uint)(iVar2 + (x->x_gui).x_w + iVar1 * -6),iVar3 + iVar1 * -2,
                iVar2 + (x->x_gui).x_w + iVar1,iVar3,"-fill","black","-tags",3,&local_288);
    pdgui_vmess((char *)0x0,"crss",p_Var4,"lower",tag_n + 0x78,tag + 0x78);
  }
  return;
}

Assistant:

static void vu_draw_io(t_vu* x, t_glist* glist, int old_snd_rcv_flags)
{
    const int zoom = IEMGUI_ZOOM(x);
    t_canvas *canvas = glist_getcanvas(glist);
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int hmargin = HMARGIN * zoom, vmargin = VMARGIN * zoom;
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    int snd_able = x->x_gui.x_fsf.x_snd_able || x->x_gui.x_fsf.x_rcv_able;
    char tag_object[128], tag_label[128], tag[128], tag_n[128];
    char *tags[] = {tag_object, tag_n, tag};

    (void)old_snd_rcv_flags;

    sprintf(tag_object, "%lxOBJ", x);
    sprintf(tag_label, "%lxLABEL", x);

    /* re-create outlets */
    sprintf(tag, "%lxOUT", x);
    pdgui_vmess(0, "crs", canvas, "delete", tag);
    if(!snd_able)
    {
        sprintf(tag_n, "%lxOUT%d", x, 0);
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos - hmargin, ypos + x->x_gui.x_h + vmargin + zoom - ioh,
            xpos - hmargin + iow, ypos + x->x_gui.x_h + vmargin,
            "-fill", "black",
            "-tags", 3, tags);

        sprintf(tag_n, "%lxOUT%d", x, 1);
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos + x->x_gui.x_w + hmargin - iow, ypos + x->x_gui.x_h + vmargin + zoom - ioh,
            xpos + x->x_gui.x_w + hmargin, ypos + x->x_gui.x_h + vmargin,
            "-fill", "black",
            "-tags", 3, tags);
            /* keep label above outlets */
        pdgui_vmess(0, "crss", canvas, "lower", tag, tag_label);
    }

    sprintf(tag, "%lxIN", x);
    pdgui_vmess(0, "crs", canvas, "delete", tag);
    if(!x->x_gui.x_fsf.x_rcv_able)
    {
        sprintf(tag_n, "%lxIN%d", x, 0);
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos - hmargin, ypos - vmargin,
            xpos - hmargin + iow, ypos - vmargin - zoom + ioh,
            "-fill", "black",
            "-tags", 3, tags);

        sprintf(tag_n, "%lxIN%d", x, 1);
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos + x->x_gui.x_w + hmargin - iow, ypos - vmargin,
            xpos + x->x_gui.x_w + hmargin, ypos - vmargin - zoom + ioh,
            "-fill", "black",
            "-tags", 3, tags);
            /* keep label above inlets */
        pdgui_vmess(0, "crss", canvas, "lower", tag, tag_label);
    }
}